

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int btrimws(bstring b)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  ushort **ppuVar4;
  ulong uVar5;
  long lVar6;
  byte bVar7;
  byte *pbVar8;
  
  if (((b != (bstring)0x0) && (pbVar8 = b->data, pbVar8 != (byte *)0x0)) &&
     (iVar3 = b->mlen, 0 < iVar3)) {
    uVar1 = b->slen;
    if (((int)uVar1 <= iVar3) && (uVar2 = (ulong)uVar1, -1 < (int)uVar1)) {
      do {
        uVar5 = uVar2;
        if ((long)uVar5 < 1) {
          *pbVar8 = 0;
          b->slen = 0;
          return 0;
        }
        bVar7 = pbVar8[uVar5 - 1];
        if ((long)(char)bVar7 < 0) break;
        ppuVar4 = __ctype_b_loc();
        uVar2 = uVar5 - 1;
      } while ((*(byte *)((long)*ppuVar4 + (long)(char)bVar7 * 2 + 1) & 0x20) != 0);
      if ((int)uVar5 <= iVar3) {
        pbVar8[uVar5 & 0xffffffff] = 0;
        pbVar8 = b->data;
      }
      b->slen = (int)uVar5;
      bVar7 = *pbVar8;
      if ((char)bVar7 < '\0') {
        lVar6 = 0;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        lVar6 = 0;
        do {
          if ((*(byte *)((long)*ppuVar4 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) break;
          bVar7 = pbVar8[lVar6 + 1];
          lVar6 = lVar6 + 1;
        } while (-1 < (char)bVar7);
      }
      iVar3 = bdelete(b,0,(int)lVar6);
      return iVar3;
    }
  }
  return -1;
}

Assistant:

int btrimws (bstring b) {
int i, j;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			for (j = 0; wspace (b->data[j]); j++) {}
			return bdelete (b, 0, j);
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return 0;
}